

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_perform_search(connectdata *conn)

{
  CURLcode CVar1;
  
  if (*(long *)((long)(conn->data->req).protop + 0x38) == 0) {
    Curl_failf(conn->data,"Cannot SEARCH without a query string.");
    CVar1 = CURLE_URL_MALFORMAT;
  }
  else {
    CVar1 = imap_sendf(conn,"SEARCH %s");
    if (CVar1 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_SEARCH;
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode imap_perform_search(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = conn->data->req.protop;

  /* Check we have a query string */
  if(!imap->query) {
    failf(conn->data, "Cannot SEARCH without a query string.");
    return CURLE_URL_MALFORMAT;
  }

  /* Send the SEARCH command */
  result = imap_sendf(conn, "SEARCH %s", imap->query);

  if(!result)
    state(conn, IMAP_SEARCH);

  return result;
}